

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void __thiscall
amrex::Geometry::GetVolume
          (Geometry *this,MultiFab *vol,BoxArray *grds,DistributionMapping *dm,int ngrow)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  undefined4 in_R8D;
  DefaultFabFactory<amrex::FArrayBox> *in_stack_ffffffffffffff50;
  MultiFab *in_stack_ffffffffffffff90;
  Geometry *in_stack_ffffffffffffff98;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_38 = 0;
  MFInfo::MFInfo((MFInfo *)0x1032dd6);
  local_60 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory(in_stack_ffffffffffffff50);
  (**(code **)(*in_RSI + 0x10))(in_RSI,in_RDX,in_RCX,1,in_R8D,&local_58,&local_60);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1032e2c);
  MFInfo::~MFInfo((MFInfo *)0x1032e36);
  GetVolume(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
Geometry::GetVolume (MultiFab&       vol,
                     const BoxArray& grds,
                     const DistributionMapping& dm,
                     int             ngrow) const
{
    vol.define(grds,dm,1,ngrow,MFInfo(),FArrayBoxFactory());
    GetVolume(vol);
}